

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall EventQueue::SendEvent(EventQueue *this,Event *ev)

{
  Event *ev_local;
  iterator ret;
  AutoLock _auto_lock_;
  
  ev_local = ev;
  AutoLock::AutoLock(&_auto_lock_,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x32);
  RefCount::AddRef(&ev->super_RefCount);
  if (ev->mPriority == 0) {
    JetHead::list<Event_*>::push_back(&this->mQueue,&ev_local);
  }
  else {
    ret.mNode = (this->mQueue).mHead;
    do {
      ret.mNode = (ret.mNode)->next;
      if (ret.mNode == (this->mQueue).mTail) {
        JetHead::list<Event_*>::push_back(&this->mQueue,&ev_local);
        goto LAB_00117f34;
      }
    } while (ev->mPriority <= (ret.mNode)->val->mPriority);
    JetHead::list<Event_*>::iterator::insertBefore(&ret,&ev_local);
  }
LAB_00117f34:
  Condition::Signal(&this->mWait);
  AutoLock::~AutoLock(&_auto_lock_);
  return;
}

Assistant:

void EventQueue::SendEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mLock );
	
	ev->AddRef();

	if ( ev->getPriority() == PRIORITY_NORMAL )
	{
		mQueue.push_back( ev );
	}
	else
	{
		int done = false;
		for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
		{
			if (ev->getPriority() > (*i)->getPriority())
			{
				i.insertBefore(ev);
				done = true;
				break;
			}
		}

		// if we didn't put the event in the list, we add it to the end.
		//  this will happend if all events in the list are of greater priority.
		if ( !done )
		{
			mQueue.push_back( ev );
		}
	}
	
	LOG( "queue size %d", mQueue.size() );	

	mWait.Signal();
}